

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O3

string * czh::utils::prettify_string(string *__return_storage_ptr__,string *buffer,int k)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  uint uVar4;
  ulong __n2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  iVar3 = (int)buffer->_M_string_length;
  uVar4 = iVar3 + k;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if ((int)uVar4 < 0x16 && -1 < k) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_70,buffer);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (&local_70,local_70._M_string_length,0,(long)(int)(uVar4 - 1),'0');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_70,".0");
  }
  else if (uVar4 - 1 < 0x15) {
    __n2 = (ulong)uVar4;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (&local_70,0,0,(buffer->_M_dataplus)._M_p,__n2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_70,'.');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (&local_70,local_70._M_string_length,0,(buffer->_M_dataplus)._M_p + __n2,
               buffer->_M_string_length - __n2);
  }
  else if (uVar4 + 5 < 6) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_70,0,0,"0.",2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (&local_70,local_70._M_string_length,0,(ulong)-uVar4,'0');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_70,(buffer->_M_dataplus)._M_p,buffer->_M_string_length);
  }
  else {
    if (iVar3 == 1) {
      pcVar2 = (buffer->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + buffer->_M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_50,"e");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_70,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace_aux(&local_70,0,0,1,*(buffer->_M_dataplus)._M_p);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_70,".");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (&local_70,local_70._M_string_length,0,(buffer->_M_dataplus)._M_p + 1,
                 (long)iVar3 - 1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_70,'e');
    }
    fill_exponent(uVar4 - 1,&local_70);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_70.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_70._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_70._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

std::string prettify_string(const std::string &buffer, int k)
  {
    std::string ret;
    int end_pos = static_cast<int>(buffer.size());
    int nb_digits = end_pos;
    int kk = nb_digits + k;
    if (nb_digits <= kk && kk <= 21)
    {
      ret = buffer;
      ret.insert(ret.end(), kk - 1, '0');
      ret += ".0";
    }
    else if (0 < kk && kk <= 21)
    {
      ret.insert(ret.end(), buffer.begin(), buffer.begin() + kk);
      ret += '.';
      ret.insert(ret.end(), buffer.begin() + kk, buffer.end());
    }
    else if (-6 < kk && kk <= 0)
    {
      ret = "0.";
      ret.insert(ret.end(), -kk, '0');
      ret += buffer;
    }
    else if (nb_digits == 1)
    {
      ret = buffer + "e";
      fill_exponent(kk - 1, ret);
    }
    else
    {
      ret = buffer[0];
      ret += ".";
      ret.insert(ret.end(), buffer.begin() + 1, buffer.begin() + nb_digits);
      ret += 'e';
      fill_exponent(kk - 1, ret);
    }
    return std::move(ret);
  }